

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxyd.c
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  __pid_t _Var8;
  int iVar9;
  size_t sVar10;
  char *pcVar11;
  int *piVar12;
  size_t sVar13;
  uint uVar14;
  char *pcVar15;
  bool bVar16;
  sigaction sigact;
  char *local_e8;
  char *local_d8;
  _union_1457 local_c8 [17];
  byte local_40;
  
  memset(local_c8,0,0x98);
  ph.priv = (void *)0x0;
  ph.conf.bind_addr = (char *)0x0;
  ph.conf.bind_addr_ext = (char *)0x0;
  ph.conf.bind_addr_ext_add = (char **)0x0;
  ph.conf.calls_allowed = (char *)0x0;
  ph.conf.calls_denied = (char *)0x0;
  ph.conf.password = (char *)0x0;
  ph.conf.reg_name = (char *)0x0;
  ph.conf.reg_comment = (char *)0x0;
  ph.conf.public_addr = (char *)0x0;
  ph.conf.connection_timeout = 0;
  ph.conf.bind_addr_ext_add_len = 0;
  ph.conf.port = 0;
  if (argc < 2) {
    local_e8 = (char *)0x0;
    bVar4 = true;
    iVar6 = 3;
    pcVar15 = (char *)0x0;
    bVar2 = true;
    iVar9 = 3;
  }
  else {
    iVar9 = 1;
    local_e8 = (char *)0x0;
    bVar3 = false;
    pcVar15 = (char *)0x0;
    bVar4 = false;
    bVar2 = false;
    bVar5 = false;
    do {
      pcVar11 = argv[iVar9];
      sVar10 = strlen(pcVar11);
      if ((sVar10 < 2) || (*pcVar11 != '-')) {
        if (sVar10 != 0) {
          bVar16 = pcVar15 == (char *)0x0;
          pcVar15 = pcVar11;
          if (bVar16) goto LAB_00101547;
LAB_00101b2f:
          main_cold_1();
LAB_00101b34:
          main_cold_4();
LAB_00101b39:
          iVar9 = strcmp(local_d8,"version");
          if (iVar9 == 0) {
LAB_00101b01:
            puts("0.9.4-dev");
            goto LAB_00101b19;
          }
        }
        main_cold_6();
        iVar9 = proxy_log(&ph,3,"Caught signal\n");
        uVar14 = (uint)pcVar11;
        if (uVar14 != 0xf) {
          if (uVar14 == 10) goto LAB_00101b98;
          if (uVar14 != 2) {
            return iVar9;
          }
        }
        sentinel = 1;
        if ((0xf < uVar14) || (iVar9 = 0x8404, (0x8404U >> (uVar14 & 0x1f) & 1) == 0)) {
          return iVar9;
        }
LAB_00101b98:
        iVar9 = proxy_shutdown(&ph);
        return iVar9;
      }
      if (pcVar11[1] == '-') {
        local_d8 = pcVar11 + 2;
        iVar6 = strcmp(local_d8,"debug");
        if (iVar6 == 0) {
          bVar3 = true;
        }
        else {
          iVar6 = strcmp(local_d8,"help");
          if (iVar6 == 0) {
LAB_00101b14:
            print_usage();
            goto LAB_00101b19;
          }
          iVar6 = strcmp(local_d8,"quiet");
          bVar5 = true;
          if (iVar6 != 0) goto LAB_00101b39;
        }
      }
      else {
        sVar13 = 1;
        do {
          bVar1 = argv[iVar9][sVar13];
          if (bVar1 < 0x56) {
            if (bVar1 == 0x46) {
              bVar4 = true;
            }
            else if (bVar1 == 0x4c) {
              if (bVar2) {
LAB_00101b25:
                main_cold_3();
                goto LAB_00101b2a;
              }
              if (sVar13 + 1 < sVar10) {
                local_e8 = argv[iVar9] + sVar13 + 1;
                sVar13 = sVar10;
              }
              else {
                iVar9 = iVar9 + 1;
                if (argc <= iVar9) goto LAB_00101b34;
                local_e8 = argv[iVar9];
              }
            }
            else {
              if (bVar1 != 0x53) goto LAB_00101b2a;
              bVar2 = true;
              if (local_e8 != (char *)0x0) {
                main_cold_2();
                goto LAB_00101b25;
              }
            }
          }
          else if (bVar1 < 0x68) {
            bVar3 = true;
            if (bVar1 != 100) {
              if (bVar1 == 0x56) goto LAB_00101b01;
LAB_00101b2a:
              main_cold_5();
              goto LAB_00101b2f;
            }
          }
          else {
            if (bVar1 != 0x71) {
              if (bVar1 != 0x68) goto LAB_00101b2a;
              goto LAB_00101b14;
            }
            bVar5 = true;
          }
          sVar13 = sVar13 + 1;
        } while (sVar13 < sVar10);
      }
LAB_00101547:
      iVar9 = iVar9 + 1;
    } while (iVar9 < argc);
    iVar6 = 4 - (uint)!bVar3;
    iVar9 = 2;
    if (!bVar5) {
      iVar9 = iVar6;
    }
    bVar4 = !bVar4;
    bVar2 = !bVar2;
  }
  if (pcVar15 == (char *)0x0) {
    iVar7 = access("ELProxy.conf",4);
    pcVar15 = "../etc/ELProxy.conf";
    if (iVar7 == 0) {
      pcVar15 = "ELProxy.conf";
    }
  }
  local_c8[0].sa_handler = graceful_shutdown;
  local_40 = local_40 | 4;
  sigaction(2,(sigaction *)local_c8,(sigaction *)0x0);
  sigaction(0xf,(sigaction *)local_c8,(sigaction *)0x0);
  sigaction(10,(sigaction *)local_c8,(sigaction *)0x0);
  iVar7 = proxy_init(&ph);
  if (iVar7 < 0) {
    main_cold_8();
    goto LAB_00101adc;
  }
  proxy_log_level(&ph,iVar9);
  iVar7 = proxy_log_select_medium(&ph,1,0);
  if (iVar7 < 0) {
    main_cold_7();
    goto LAB_00101adc;
  }
  iVar7 = proxy_load_conf(&ph,pcVar15);
  if (iVar7 < 0) {
    pcVar11 = strerror(-iVar7);
    proxy_log(&ph,0,"Failed to load config from \'%s\' (%d): %s\n",pcVar15,-iVar7,pcVar11);
    goto LAB_00101adc;
  }
  iVar9 = proxy_open();
  if (iVar9 < 0) {
    iVar6 = -iVar9;
    pcVar15 = strerror(iVar6);
    pcVar11 = "Failed to open proxy (%d): %s\n";
    iVar7 = iVar9;
  }
  else {
    if (bVar4) {
      iVar7 = fork();
      if (iVar7 < 0) {
        bVar2 = false;
        proxy_log(&ph,0,"Error forking daemon process\n");
      }
      else {
        if (iVar7 != 0) {
LAB_00101b19:
          exit(0);
        }
        if (local_e8 == (char *)0x0) {
          iVar7 = iVar9;
          if (!bVar2) {
            iVar7 = proxy_log_select_medium(&ph,3,0);
            if (iVar7 != 0) {
              pcVar15 = "Failed to activate syslog (%d): %s\n";
              goto LAB_001018fe;
            }
            goto LAB_00101928;
          }
        }
        else {
          iVar7 = proxy_log_select_medium(&ph,2);
          if (iVar7 != 0) {
            pcVar15 = "Failed to open log file (%d): %s\n";
LAB_001018fe:
            pcVar11 = strerror(-iVar7);
            proxy_log(&ph,1,pcVar15,-iVar7,pcVar11);
          }
LAB_00101928:
          proxy_log_level(&ph,iVar6);
        }
        umask(0);
        _Var8 = setsid();
        if (_Var8 < 0) {
          piVar12 = __errno_location();
          iVar9 = *piVar12;
          pcVar15 = strerror(iVar9);
          pcVar11 = "Process error (%d): %s\n";
        }
        else {
          iVar9 = chdir("/");
          if (-1 < iVar9) {
            close(0);
            close(1);
            close(2);
            bVar2 = true;
            goto LAB_001019ca;
          }
          piVar12 = __errno_location();
          iVar9 = *piVar12;
          pcVar15 = strerror(iVar9);
          pcVar11 = "Failed to change dir (%d): %s\n";
        }
        bVar2 = false;
        proxy_log(&ph,0,pcVar11,iVar9,pcVar15);
        iVar7 = *piVar12;
      }
LAB_001019ca:
      if (!bVar2) goto LAB_00101adc;
    }
    else if (local_e8 == (char *)0x0) {
      if (!bVar2) {
        proxy_log(&ph,3,"Switching log to syslog\n");
        iVar9 = proxy_log_select_medium(&ph,3,0);
        if (iVar9 != 0) {
          pcVar15 = "Failed to activate syslog (%d): %s\n";
          goto LAB_00101892;
        }
      }
    }
    else {
      proxy_log(&ph,3,"Switching log to file \"%s\"\n",local_e8);
      iVar9 = proxy_log_select_medium(&ph,2,local_e8);
      if (iVar9 != 0) {
        pcVar15 = "Failed to open log file (%d): %s\n";
LAB_00101892:
        pcVar11 = strerror(-iVar9);
        proxy_log(&ph,1,pcVar15,-iVar9,pcVar11);
      }
    }
    iVar7 = proxy_start(&ph);
    if (-1 < iVar7) {
      proxy_log(&ph,3,"Ready.\n");
      while ((iVar7 == 0 && ((sentinel & 1) == 0))) {
        proxy_log(&ph,4,"Starting a processing run...\n");
        iVar7 = proxy_process(&ph);
        if (iVar7 < 0) {
          if (iVar7 == -4) {
            iVar7 = 0;
            while (sentinel == 0) {
              usleep(50000);
            }
          }
          else {
            pcVar15 = strerror(-iVar7);
            proxy_log(&ph,0,"Message processing failure (%d): %s\n",-iVar7,pcVar15);
          }
        }
      }
      proxy_log(&ph,3,"Shutting down...\n");
      goto LAB_00101adc;
    }
    iVar6 = -iVar7;
    pcVar15 = strerror(iVar6);
    pcVar11 = "Failed to start proxy (%d): %s\n";
  }
  proxy_log(&ph,0,pcVar11,iVar6,pcVar15);
LAB_00101adc:
  proxy_free(&ph);
  return iVar7;
}

Assistant:

int main(int argc, const char * const argv[])
{
	struct proxy_opts opts;

#ifndef _WIN32
	struct sigaction sigact;
#endif
	int ret;

	memset(&opts, 0x0, sizeof(opts));
#ifndef _WIN32
	memset(&sigact, 0x0, sizeof(sigact));
#endif
	memset(&ph, 0x0, sizeof(ph));

	parse_args(argc, argv, &opts);
	if (opts.config_path == NULL) {
#ifdef OPENELP_CONFIG_HINT
		opts.config_path = proxy_config_hint();
#else
		opts.config_path = config_path_default;
#endif
	}

#ifndef _WIN32
	/* Handle SIGINT/SIGTERM */
	sigact.sa_sigaction = graceful_shutdown;
	sigact.sa_flags |= SA_SIGINFO;

	sigaction(SIGINT, &sigact, NULL);
	sigaction(SIGTERM, &sigact, NULL);
	sigaction(SIGUSR1, &sigact, NULL);
#else
	if (!SetConsoleCtrlHandler(graceful_shutdown, TRUE))
		fprintf(stderr, "Failed to set signal handler (%d)\n",
			GetLastError());

#endif

	/* Initialize proxy */
	ret = proxy_init(&ph);
	if (ret < 0) {
		fprintf(stderr, "Failed to initialize proxy (%d): %s\n", -ret,
			strerror(-ret));
		goto proxyd_exit;
	}

	/* Set the initial logging level */
	proxy_log_level(&ph, opts.quiet ? LOG_LEVEL_WARN : opts.debug ?
			LOG_LEVEL_DEBUG : LOG_LEVEL_INFO);

	/* Open the log */
	ret = proxy_log_select_medium(&ph, LOG_MEDIUM_STDOUT, NULL);
	if (ret < 0) {
		fprintf(stderr, "Failed to switch log to STDOUT (%d): %s\n",
			-ret, strerror(-ret));
		goto proxyd_exit;
	}

	/* Load the config */
	ret = proxy_load_conf(&ph, opts.config_path);
	if (ret < 0) {
		proxy_log(&ph, LOG_LEVEL_FATAL,
			  "Failed to load config from '%s' (%d): %s\n",
			  opts.config_path, -ret, strerror(-ret));
		goto proxyd_exit;
	}

	/* Start listening */
	ret = proxy_open(&ph);
	if (ret < 0) {
		proxy_log(&ph, LOG_LEVEL_FATAL,
			  "Failed to open proxy (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxyd_exit;
	}

#ifndef _WIN32
	/* Daemonize */
	if (!opts.foreground) {
		pid_t pid;
		pid_t sid;

		pid = fork();

		if (pid < 0) {
			proxy_log(&ph, LOG_LEVEL_FATAL,
				  "Error forking daemon process\n");
			ret = pid;
			goto proxyd_exit;
		}

		if (pid > 0)
			exit(0);

		/*! @TODO Double-fork */

		if (opts.log_path) {
			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_FILE,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to open log file (%d): %s\n",
					  -ret, strerror(-ret));
			proxy_log_level(&ph, opts.debug ? LOG_LEVEL_DEBUG :
					LOG_LEVEL_INFO);
		} else if (opts.syslog) {
			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_SYSLOG,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to activate syslog (%d): %s\n",
					  -ret, strerror(-ret));
			proxy_log_level(&ph, opts.debug ? LOG_LEVEL_DEBUG :
					LOG_LEVEL_INFO);
		}

		umask(0);

		sid = setsid();
		if (sid < 0) {
			proxy_log(&ph, LOG_LEVEL_FATAL,
				  "Process error (%d): %s\n",
				  errno, strerror(errno));
			ret = errno;
			goto proxyd_exit;
		}

		if (chdir("/") < 0) {
			proxy_log(&ph, LOG_LEVEL_FATAL,
				  "Failed to change dir (%d): %s\n",
				  errno, strerror(errno));
			ret = errno;
			goto proxyd_exit;
		}

		close(STDIN_FILENO);
		close(STDOUT_FILENO);
		close(STDERR_FILENO);
	} else
#endif
	{
		/* Switch log, if necessary */
		if (opts.log_path) {
			proxy_log(&ph, LOG_LEVEL_INFO,
				  "Switching log to file \"%s\"\n",
				  opts.log_path);

			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_FILE,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to open log file (%d): %s\n",
					  -ret, strerror(-ret));
		} else if (opts.syslog) {
			proxy_log(&ph, LOG_LEVEL_INFO,
				  "Switching log to syslog\n");

			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_SYSLOG,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to activate syslog (%d): %s\n",
					  -ret, strerror(-ret));
		} else if (opts.eventlog) {
			proxy_log(&ph, LOG_LEVEL_INFO,
				  "Switching log to eventlog\n");

			ret = proxy_log_select_medium(&ph, LOG_MEDIUM_EVENTLOG,
						      opts.log_path);
			if (ret != 0)
				proxy_log(&ph, LOG_LEVEL_ERROR,
					  "Failed to activate eventlog (%d): %s\n",
					  -ret, strerror(-ret));
		}
	}

	ret = proxy_start(&ph);
	if (ret < 0) {
		proxy_log(&ph, LOG_LEVEL_FATAL,
			  "Failed to start proxy (%d): %s\n",
			  -ret, strerror(-ret));
		goto proxyd_exit;
	}

	proxy_log(&ph, LOG_LEVEL_INFO, "Ready.\n");

	/* Main dispatch loop */
	while (ret == 0 && sentinel == 0) {
		proxy_log(&ph, LOG_LEVEL_DEBUG,
			  "Starting a processing run...\n");
		ret = proxy_process(&ph);
		if (ret < 0) {
			switch (ret) {
			case -EINTR:
				ret = 0;

				/*! @TODO Something better than a busy loop */
				while (!sentinel) {
#ifdef _WIN32
					Sleep(50);
#else
					usleep(50000);
#endif
				}

				break;
			default:
				proxy_log(&ph, LOG_LEVEL_FATAL,
					  "Message processing failure (%d): %s\n",
					  -ret, strerror(-ret));
				break;
			}
		}
	}

	proxy_log(&ph, LOG_LEVEL_INFO, "Shutting down...\n");

proxyd_exit:
	proxy_free(&ph);

#ifdef _WIN32
	if (ret != 0) {
		HWND console_window = GetConsoleWindow();

		if (console_window != NULL) {
			DWORD process_id;

			GetWindowThreadProcessId(console_window, &process_id);
			if (GetCurrentProcessId() == process_id) {
				printf("Press any key to exit . . . ");
				_getch();
			}
		}
	}
#endif

	return ret;
}